

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  DebugInfo *__ptr;
  bool bVar1;
  Value *pVVar2;
  DebugInfo *this_00;
  cmake *this_01;
  pointer __p;
  cmServerResponse response;
  Value value;
  Value debugValue;
  cmServerRequest request;
  Reader reader;
  DebugInfo *local_350;
  undefined1 local_348 [32];
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  Value local_2e0;
  string local_2b8;
  Value local_298;
  string local_270;
  string local_250;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  Value local_1f0;
  Value local_1c8;
  cmServerRequest local_1a0;
  Reader local_128;
  
  Json::Reader::Reader(&local_128);
  Json::Value::Value(&local_298,nullValue);
  bVar1 = Json::Reader::parse(&local_128,input,&local_298,true);
  if (bVar1) {
    local_350 = (DebugInfo *)0x0;
    pVVar2 = Json::Value::operator[](&local_298,"debug");
    Json::Value::Value(&local_1f0,pVVar2);
    bVar1 = Json::Value::isNull(&local_1f0);
    if (!bVar1) {
      this_00 = (DebugInfo *)operator_new(0x30);
      DebugInfo::DebugInfo(this_00);
      __ptr = local_350;
      local_348._0_8_ = (DebugInfo *)0x0;
      bVar1 = local_350 != (DebugInfo *)0x0;
      local_350 = this_00;
      if (bVar1) {
        std::default_delete<cmServer::DebugInfo>::operator()
                  ((default_delete<cmServer::DebugInfo> *)&local_350,__ptr);
        if ((DebugInfo *)local_348._0_8_ != (DebugInfo *)0x0) {
          std::default_delete<cmServer::DebugInfo>::operator()
                    ((default_delete<cmServer::DebugInfo> *)local_348,(DebugInfo *)local_348._0_8_);
        }
      }
      pVVar2 = Json::Value::operator[](&local_1f0,"dumpToFile");
      Json::Value::asString_abi_cxx11_((string *)local_348,pVVar2);
      std::__cxx11::string::operator=((string *)&local_350->OutputFile,(string *)local_348);
      if ((DebugInfo *)local_348._0_8_ != (DebugInfo *)(local_348 + 0x10)) {
        operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
      }
      pVVar2 = Json::Value::operator[](&local_1f0,"showStats");
      bVar1 = Json::Value::asBool(pVVar2);
      local_350->PrintStatistics = bVar1;
    }
    pVVar2 = Json::Value::operator[](&local_298,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_250,pVVar2);
    pVVar2 = Json::Value::operator[](&local_298,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_270,pVVar2);
    Json::Value::Value(&local_1c8,&local_298);
    cmServerRequest::cmServerRequest(&local_1a0,this,connection,&local_250,&local_270,&local_1c8);
    Json::Value::~Value(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0.Type._M_string_length == 0) {
      cmServerResponse::cmServerResponse((cmServerResponse *)local_348,&local_1a0);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,"No type given in request.","");
      cmServerResponse::SetError((cmServerResponse *)local_348,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      WriteResponse(this,connection,(cmServerResponse *)local_348,(DebugInfo *)0x0);
    }
    else {
      local_210._8_8_ = 0;
      local_1f8 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:100:5)>
                  ::_M_invoke;
      local_200 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:100:5)>
                  ::_M_manager;
      local_210._M_unused._M_object = &local_1a0;
      cmSystemTools::SetMessageCallback((MessageCallback *)&local_210);
      if (local_200 != (code *)0x0) {
        (*local_200)(&local_210,&local_210,__destroy_functor);
      }
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion((cmServerResponse *)local_348,this,&local_1a0);
        WriteResponse(this,connection,(cmServerResponse *)local_348,local_350);
      }
      else {
        this_01 = cmServerProtocol::CMakeInstance(this->Protocol);
        local_230._8_8_ = 0;
        local_218 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:106:7)>
                    ::_M_invoke;
        local_220 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:106:7)>
                    ::_M_manager;
        local_230._M_unused._M_object = &local_1a0;
        cmake::SetProgressCallback(this_01,(ProgressCallbackType *)&local_230);
        if (local_220 != (code *)0x0) {
          (*local_220)(&local_230,&local_230,__destroy_functor);
        }
        (*this->Protocol->_vptr_cmServerProtocol[4])(local_348,this->Protocol,&local_1a0);
        WriteResponse(this,connection,(cmServerResponse *)local_348,local_350);
      }
    }
    Json::Value::~Value(&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_p != &local_2f0) {
      operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_p != &local_318) {
      operator_delete(local_328._M_p,local_318._0_8_ + 1);
    }
    if ((DebugInfo *)local_348._0_8_ != (DebugInfo *)(local_348 + 0x10)) {
      operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
    }
    Json::Value::~Value(&local_1a0.Data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.Cookie._M_dataplus._M_p != &local_1a0.Cookie.field_2) {
      operator_delete(local_1a0.Cookie._M_dataplus._M_p,
                      local_1a0.Cookie.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.Type._M_dataplus._M_p != &local_1a0.Type.field_2) {
      operator_delete(local_1a0.Type._M_dataplus._M_p,
                      local_1a0.Type.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value(&local_1f0);
    if (local_350 != (DebugInfo *)0x0) {
      std::default_delete<cmServer::DebugInfo>::operator()
                ((default_delete<cmServer::DebugInfo> *)&local_350,local_350);
    }
  }
  else {
    local_348._0_8_ = (DebugInfo *)(local_348 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"Failed to parse JSON input.","");
    WriteParseError(this,connection,(string *)local_348);
    if ((DebugInfo *)local_348._0_8_ != (DebugInfo *)(local_348 + 0x10)) {
      operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
    }
  }
  Json::Value::~Value(&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.commentsBefore_._M_dataplus._M_p != &local_128.commentsBefore_.field_2) {
    operator_delete(local_128.commentsBefore_._M_dataplus._M_p,
                    local_128.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.document_._M_dataplus._M_p != &local_128.document_.field_2) {
    operator_delete(local_128.document_._M_dataplus._M_p,
                    local_128.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_128.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_128);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = cm::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type.empty()) {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(
    [&request](const std::string& msg, const char* title) {
      reportMessage(msg, title, request);
    });

  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      [&request](const std::string& msg, float prog) {
        reportProgress(msg, prog, request);
      });
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}